

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O2

void testStandardAttributes(string *tempDir)

{
  uint16_t uVar1;
  undefined8 uVar2;
  ulong uVar3;
  Vec2<float> VVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ostream *poVar8;
  Header *pHVar9;
  float *pfVar10;
  void *pvVar11;
  Vec3 *pVVar12;
  Box *pBVar13;
  Box<Imath_3_2::Vec2<int>_> *pBVar14;
  half *phVar15;
  undefined8 uVar16;
  char *pcVar17;
  int x;
  uint uVar18;
  Vec2 *pVVar19;
  long lVar20;
  int y_1;
  uint uVar21;
  long lVar22;
  char *__assertion;
  int x_1;
  int iVar23;
  long lVar24;
  long lVar25;
  int y;
  long lVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  V3f R1;
  int iStack_49c;
  V3f G1;
  int local_47c;
  V3f R2;
  CubeMapFace face;
  V3f B1;
  Chromaticities c;
  float fStack_444;
  Vec2<float> local_440;
  undefined1 local_438 [20];
  float local_424;
  V3f W1;
  V3f G2;
  M44f M2;
  CubeMapFace face_2;
  char *local_3a8;
  Rand48 rand_1;
  undefined2 uStack_39a;
  V3f B2;
  Vec3<float> local_380;
  V3f W2;
  Vec2<float> local_360;
  M44f M1;
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar47 [16];
  
  poVar8 = std::operator<<((ostream *)&std::cout,"Testing optional standard attributes");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"conversion from RGB to XYZ");
  std::endl<char,std::char_traits<char>>(poVar8);
  M1.x[0][0] = 0.64;
  M1.x[0][1] = 0.33;
  M2.x[0][0] = 0.3;
  M2.x[0][1] = 0.6;
  R1.x = 0.15;
  R1.y = 0.06;
  G1.x = 0.3127;
  G1.y = 0.329;
  Imf_3_2::Chromaticities::Chromaticities(&c,(Vec2 *)&M1,(Vec2 *)&M2,(Vec2 *)&R1,(Vec2 *)&G1);
  Imf_3_2::RGBtoXYZ((Chromaticities *)&M1,100.0);
  M2.x[0][0] = 1.0;
  M2.x[0][1] = 0.0;
  M2.x[0][2] = 0.0;
  Imath_3_2::operator*((Vec3<float> *)&M2,&M1);
  M2.x[0][0] = 0.0;
  M2.x[0][1] = 1.0;
  M2.x[0][2] = 0.0;
  Imath_3_2::operator*((Vec3<float> *)&M2,&M1);
  M2.x[0][0] = 0.0;
  M2.x[0][1] = 0.0;
  M2.x[0][2] = 1.0;
  Imath_3_2::operator*((Vec3<float> *)&M2,&M1);
  M2.x[0][0] = 1.0;
  M2.x[0][1] = 1.0;
  M2.x[0][2] = 1.0;
  Imath_3_2::operator*((Vec3<float> *)&M2,&M1);
  poVar8 = std::operator<<((ostream *)&std::cout,"red   XYZ = ");
  poVar8 = Imath_3_2::operator<<(poVar8,&R1);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"green XYZ = ");
  poVar8 = Imath_3_2::operator<<(poVar8,&G1);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"blue  XYZ = ");
  poVar8 = Imath_3_2::operator<<(poVar8,&B1);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"white XYZ = ");
  poVar8 = Imath_3_2::operator<<(poVar8,&W1);
  std::endl<char,std::char_traits<char>>(poVar8);
  auVar28._8_8_ = 0;
  auVar28._0_4_ = R1.x;
  auVar28._4_4_ = R1.y;
  fVar27 = R1.y;
  auVar31._4_4_ = fVar27;
  auVar31._0_4_ = fVar27;
  auVar31._8_4_ = fVar27;
  auVar31._12_4_ = fVar27;
  auVar32._4_12_ = auVar31._4_12_;
  auVar32._0_4_ = fVar27 + R1.x + R1.z;
  auVar34._0_8_ = auVar32._0_8_;
  auVar34._8_4_ = fVar27;
  auVar34._12_4_ = fVar27;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._4_4_ = auVar32._0_4_;
  auVar33._0_4_ = auVar32._0_4_;
  auVar28 = divps(auVar28,auVar33);
  _rand_1 = auVar28._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = G1.x;
  auVar29._4_4_ = G1.y;
  fVar27 = G1.y;
  auVar35._4_4_ = fVar27;
  auVar35._0_4_ = fVar27;
  auVar35._8_4_ = fVar27;
  auVar35._12_4_ = fVar27;
  auVar36._4_12_ = auVar35._4_12_;
  auVar36._0_4_ = fVar27 + G1.x + G1.z;
  auVar38._0_8_ = auVar36._0_8_;
  auVar38._8_4_ = fVar27;
  auVar38._12_4_ = fVar27;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._4_4_ = auVar36._0_4_;
  auVar37._0_4_ = auVar36._0_4_;
  auVar28 = divps(auVar29,auVar37);
  _face = auVar28._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_4_ = B1.x;
  auVar30._4_4_ = B1.y;
  fVar27 = B1.y;
  auVar39._4_4_ = fVar27;
  auVar39._0_4_ = fVar27;
  auVar39._8_4_ = fVar27;
  auVar39._12_4_ = fVar27;
  auVar40._4_12_ = auVar39._4_12_;
  auVar40._0_4_ = fVar27 + B1.x + B1.z;
  auVar42._0_8_ = auVar40._0_8_;
  auVar42._8_4_ = fVar27;
  auVar42._12_4_ = fVar27;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._4_4_ = auVar40._0_4_;
  auVar41._0_4_ = auVar40._0_4_;
  auVar28 = divps(auVar30,auVar41);
  auVar43._4_4_ = W1.y;
  auVar43._0_4_ = W1.x;
  auVar43._8_8_ = 0;
  auVar44._4_4_ = W1.y;
  auVar44._0_4_ = W1.y;
  auVar44._8_4_ = W1.y;
  auVar44._12_4_ = W1.y;
  auVar45._4_12_ = auVar44._4_12_;
  auVar45._0_4_ = W1.y + W1.x + W1.z;
  _face_2 = auVar28._0_8_;
  auVar47._0_8_ = auVar45._0_8_;
  auVar47._8_4_ = W1.y;
  auVar47._12_4_ = W1.y;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._4_4_ = auVar45._0_4_;
  auVar46._0_4_ = auVar45._0_4_;
  auVar28 = divps(auVar43,auVar46);
  local_360 = auVar28._0_8_;
  poVar8 = std::operator<<((ostream *)&std::cout,"red   xy = ");
  poVar8 = Imath_3_2::operator<<(poVar8,(Vec2<float> *)&rand_1);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"green xy = ");
  poVar8 = Imath_3_2::operator<<(poVar8,(Vec2<float> *)&face);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"blue  xy = ");
  poVar8 = Imath_3_2::operator<<(poVar8,(Vec2<float> *)&face_2);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"white xy = ");
  poVar8 = Imath_3_2::operator<<(poVar8,&local_360);
  std::endl<char,std::char_traits<char>>(poVar8);
  fVar27 = W1.y;
  if (W1.y <= -W1.y) {
    fVar27 = -W1.y;
  }
  if (fVar27 * 1e-05 <
      (float)(-(uint)(100.0 < W1.y) & (uint)(W1.y + -100.0) |
             ~-(uint)(100.0 < W1.y) & (uint)(100.0 - W1.y))) {
    __assertion = "equalWithRelError (W1.y, Y, 1e-5F)";
    pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
    uVar18 = 0x38;
  }
  else {
    bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                      ((Vec2<float> *)&rand_1,(Vec2<float> *)&c,1e-05);
    if (bVar5) {
      bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError((Vec2<float> *)&face,&local_440,1e-05);
      if (bVar5) {
        bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                          ((Vec2<float> *)&face_2,(Vec2<float> *)local_438,1e-05);
        if (bVar5) {
          bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                            (&local_360,(Vec2<float> *)(local_438 + 8),1e-05);
          if (bVar5) {
            poVar8 = std::operator<<((ostream *)&std::cout,"conversion from XYZ to RGB");
            std::endl<char,std::char_traits<char>>(poVar8);
            Imf_3_2::XYZtoRGB((Chromaticities *)&M2,100.0);
            Imath_3_2::operator*(&R1,&M2);
            Imath_3_2::operator*(&G1,&M2);
            Imath_3_2::operator*(&B1,&M2);
            Imath_3_2::operator*(&W1,&M2);
            poVar8 = std::operator<<((ostream *)&std::cout,"red   RGB = ");
            poVar8 = Imath_3_2::operator<<(poVar8,&R2);
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"green RGB = ");
            poVar8 = Imath_3_2::operator<<(poVar8,&G2);
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"blue  RGB = ");
            poVar8 = Imath_3_2::operator<<(poVar8,&B2);
            std::endl<char,std::char_traits<char>>(poVar8);
            poVar8 = std::operator<<((ostream *)&std::cout,"white RGB = ");
            poVar8 = Imath_3_2::operator<<(poVar8,&W2);
            std::endl<char,std::char_traits<char>>(poVar8);
            local_380.x = 1.0;
            local_380.y = 0.0;
            local_380.z = 0.0;
            bVar5 = Imath_3_2::Vec3<float>::equalWithAbsError(&R2,&local_380,0.001);
            if (bVar5) {
              local_380.x = 0.0;
              local_380.y = 1.0;
              local_380.z = 0.0;
              bVar5 = Imath_3_2::Vec3<float>::equalWithAbsError(&G2,&local_380,0.001);
              if (bVar5) {
                local_380.x = 0.0;
                local_380.y = 0.0;
                local_380.z = 1.0;
                bVar5 = Imath_3_2::Vec3<float>::equalWithAbsError(&B2,&local_380,0.001);
                if (bVar5) {
                  local_380.x = 1.0;
                  local_380.y = 1.0;
                  local_380.z = 1.0;
                  bVar5 = Imath_3_2::Vec3<float>::equalWithAbsError(&W2,&local_380,0.001);
                  if (bVar5) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&R1,tempDir,"imf_test_chromaticities.exr");
                    uVar2 = R1._0_8_;
                    poVar8 = std::operator<<((ostream *)&std::cout,"chromaticities attribute");
                    std::endl<char,std::char_traits<char>>(poVar8);
                    std::operator<<((ostream *)&std::cout,"writing, ");
                    M1.x[0][0] = 1.0;
                    M1.x[0][1] = 2.0;
                    M2.x[0][0] = 3.0;
                    M2.x[0][1] = 4.0;
                    G1.x = 5.0;
                    G1.y = 6.0;
                    B1.x = 7.0;
                    B1.y = 8.0;
                    Imf_3_2::Chromaticities::Chromaticities
                              (&c,(Vec2 *)&M1,(Vec2 *)&M2,(Vec2 *)&G1,(Vec2 *)&B1);
                    pVVar19 = (Vec2 *)&M1;
                    M1.x[0][0] = 0.0;
                    M1.x[0][1] = 0.0;
                    Imf_3_2::Header::Header
                              ((Header *)&M2,100,100,1.0,pVVar19,1.0,INCREASING_Y,ZIP_COMPRESSION);
                    cVar6 = Imf_3_2::hasChromaticities((Header *)&M2);
                    if (cVar6 == '\0') {
                      Imf_3_2::addChromaticities((Header *)&M2,&c);
                      cVar6 = Imf_3_2::hasChromaticities((Header *)&M2);
                      if (cVar6 == '\0') {
                        __assertion = "hasChromaticities (header) == true";
                        pcVar17 = 
                        "void (anonymous namespace)::writeReadChromaticities(const char *)";
                        uVar18 = 0x61;
                      }
                      else {
                        iVar7 = Imf_3_2::globalThreadCount();
                        Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                  ((RgbaOutputFile *)&G1,(char *)uVar2,(Header *)&M2,WRITE_RGBA,
                                   iVar7);
                        lVar26 = 100;
                        while( true ) {
                          bVar5 = lVar26 == 0;
                          lVar26 = lVar26 + -1;
                          if (bVar5) break;
                          Imath_3_2::half::operator=((half *)pVVar19,1.0);
                          Imath_3_2::half::operator=((half *)(pVVar19 + 2),1.0);
                          Imath_3_2::half::operator=((half *)(pVVar19 + 4),1.0);
                          Imath_3_2::half::operator=((half *)(pVVar19 + 6),1.0);
                          pVVar19 = pVVar19 + 8;
                        }
                        Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&G1,(ulong)&M1,1);
                        Imf_3_2::RgbaOutputFile::writePixels((int)&G1);
                        Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                        poVar8 = std::operator<<((ostream *)&std::cout,"reading, comparing");
                        std::endl<char,std::char_traits<char>>(poVar8);
                        iVar7 = Imf_3_2::globalThreadCount();
                        Imf_3_2::RgbaInputFile::RgbaInputFile
                                  ((RgbaInputFile *)&M1,(char *)uVar2,iVar7);
                        pHVar9 = (Header *)Imf_3_2::RgbaInputFile::header();
                        pfVar10 = (float *)Imf_3_2::chromaticities(pHVar9);
                        pHVar9 = (Header *)Imf_3_2::RgbaInputFile::header();
                        cVar6 = Imf_3_2::hasChromaticities(pHVar9);
                        if (cVar6 == '\0') {
                          __assertion = "hasChromaticities (in.header ()) == true";
                          pcVar17 = 
                          "void (anonymous namespace)::writeReadChromaticities(const char *)";
                          uVar18 = 0x79;
                        }
                        else if ((((_c != *pfVar10) || (NAN(_c) || NAN(*pfVar10))) ||
                                 (fStack_444 != pfVar10[1])) || (NAN(fStack_444) || NAN(pfVar10[1]))
                                ) {
                          __assertion = "c1.red == c2.red";
                          pcVar17 = 
                          "void (anonymous namespace)::writeReadChromaticities(const char *)";
                          uVar18 = 0x7a;
                        }
                        else if (((local_440.x != pfVar10[2]) ||
                                 (NAN(local_440.x) || NAN(pfVar10[2]))) ||
                                ((local_440.y != pfVar10[3] || (NAN(local_440.y) || NAN(pfVar10[3]))
                                 ))) {
                          __assertion = "c1.green == c2.green";
                          pcVar17 = 
                          "void (anonymous namespace)::writeReadChromaticities(const char *)";
                          uVar18 = 0x7b;
                        }
                        else if ((((float)local_438._0_4_ != pfVar10[4]) ||
                                 (NAN((float)local_438._0_4_) || NAN(pfVar10[4]))) ||
                                (((float)local_438._4_4_ != pfVar10[5] ||
                                 (NAN((float)local_438._4_4_) || NAN(pfVar10[5]))))) {
                          __assertion = "c1.blue == c2.blue";
                          pcVar17 = 
                          "void (anonymous namespace)::writeReadChromaticities(const char *)";
                          uVar18 = 0x7c;
                        }
                        else {
                          if (((float)local_438._8_4_ == pfVar10[6]) &&
                             (!NAN((float)local_438._8_4_) && !NAN(pfVar10[6]))) {
                            if (((float)local_438._12_4_ == pfVar10[7]) &&
                               (!NAN((float)local_438._12_4_) && !NAN(pfVar10[7]))) {
                              Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                              remove((char *)uVar2);
                              Imf_3_2::Header::~Header((Header *)&M2);
                              std::__cxx11::string::~string((string *)&R1);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&M2,tempDir,"imf_test_latlong1.exr");
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&c,tempDir,"imf_test_latlong2.exr");
                              local_3a8 = (char *)M2.x[0]._0_8_;
                              pcVar17 = (char *)CONCAT44(fStack_444,_c);
                              poVar8 = std::operator<<((ostream *)&std::cout,
                                                       "latitude-longitude environment map");
                              std::endl<char,std::char_traits<char>>(poVar8);
                              R1.x = 0.0;
                              R1.y = 0.0;
                              Imf_3_2::Header::Header
                                        ((Header *)&M1,0x168,0xb4,1.0,(Vec2 *)&R1,1.0,INCREASING_Y,
                                         ZIP_COMPRESSION);
                              R1._0_8_ = R1._0_8_ & 0xffffffff00000000;
                              Imf_3_2::addEnvmap((Header *)&M1,(Envmap *)&R1);
                              R1.x = 0.0;
                              R1.y = 1.0;
                              R1.z = 0.0;
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              fVar27 = G1.x;
                              if (1e-06 < (float)(-(uint)(1.5707964 < fVar27) &
                                                  (uint)(fVar27 + -1.5707964) |
                                                 ~-(uint)(1.5707964 < fVar27) &
                                                 (uint)(1.5707964 - fVar27))) {
                                __assert_fail("equalWithAbsError (pos.x, float (M_PI / 2), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x90,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = -1.0;
                              R1.z = 0.0;
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              fVar27 = G1.x;
                              if (1e-06 < (float)(-(uint)(-1.5707964 < fVar27) &
                                                  (uint)(fVar27 + 1.5707964) |
                                                 ~-(uint)(-1.5707964 < fVar27) &
                                                 (uint)(-1.5707964 - fVar27))) {
                                __assert_fail("equalWithAbsError (pos.x, float (-M_PI / 2), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x93,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = 0.0;
                              R1.z = 1.0;
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              R1.x = 0.0;
                              R1.y = 0.0;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x96,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 1.0;
                              R1.y = 0.0;
                              R1.z = 0.0;
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              R1.x = 0.0;
                              R1.y = 1.5707964;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (0, M_PI / 2), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x99,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = -1.0;
                              R1.y = 0.0;
                              R1.z = 0.0;
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              R1.x = 0.0;
                              R1.y = -1.5707964;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (0, -M_PI / 2), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x9c,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = 1.0;
                              R1.z = 1.0;
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              R1.x = 0.7853982;
                              R1.y = 0.0;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (M_PI / 4, 0), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x9f,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = -1.0;
                              stack0xfffffffffffffb60 = CONCAT44(iStack_49c,0x3f800000);
                              Imf_3_2::LatLongMap::latLong((Vec3 *)&G1);
                              R2.x = G1.x;
                              R2.y = G1.y;
                              R1.x = -0.7853982;
                              R1.y = 0.0;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,1e-06);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (-M_PI / 4, 0), 1e-6f)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0xa2,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              pVVar19 = (Vec2 *)Imf_3_2::Header::dataWindow();
                              G1.x = 1.5707964;
                              G1.y = 3.1415927;
                              Imf_3_2::LatLongMap::pixelPosition((Box *)&R1,pVVar19);
                              R2.x = R1.x;
                              R2.y = R1.y;
                              R1.x = 0.0;
                              R1.y = 0.0;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.00036);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (0, 0), 1e-6f * W)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0xa6,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              pVVar19 = (Vec2 *)Imf_3_2::Header::dataWindow();
                              G1.x = -1.5707964;
                              G1.y = -3.1415927;
                              Imf_3_2::LatLongMap::pixelPosition((Box *)&R1,pVVar19);
                              R2.x = R1.x;
                              R2.y = R1.y;
                              lVar26 = Imf_3_2::Header::dataWindow();
                              R1.x = (float)(int)*(undefined8 *)(lVar26 + 8);
                              R1.y = (float)(int)((ulong)*(undefined8 *)(lVar26 + 8) >> 0x20);
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.00036);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f (header.dataWindow ().max), 1e-6f * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0xaa,
                                              "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 2.52234e-43;
                              R1.y = 0.0;
                              stack0xfffffffffffffb60 = 0x168;
                              pvVar11 = operator_new__(0x7e900);
                              lVar24 = 0;
                              for (lVar26 = 0; lVar26 != 0xb4; lVar26 = lVar26 + 1) {
                                local_424 = (float)(int)lVar26;
                                lVar22 = 4;
                                for (lVar20 = 0; uVar3 = stack0xfffffffffffffb60, lVar20 != 0x168;
                                    lVar20 = lVar20 + 1) {
                                  pVVar19 = (Vec2 *)Imf_3_2::Header::dataWindow();
                                  B1.y = local_424;
                                  B1.x = (float)(int)lVar20;
                                  Imf_3_2::LatLongMap::direction((Box *)&G1,pVVar19);
                                  lVar25 = uVar3 * lVar24;
                                  Imath_3_2::half::operator=
                                            ((half *)((long)pvVar11 + lVar22 + lVar25 + -4),
                                             G1.x + 1.0);
                                  Imath_3_2::half::operator=
                                            ((half *)((long)pvVar11 + lVar22 + lVar25 + -2),
                                             G1.y + 1.0);
                                  Imath_3_2::half::operator=
                                            ((half *)((long)pvVar11 + lVar22 + lVar25),G1.z + 1.0);
                                  lVar22 = lVar22 + 8;
                                }
                                lVar24 = lVar24 + 8;
                              }
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        ((RgbaOutputFile *)&G1,local_3a8,(Header *)&M1,WRITE_RGB,
                                         iVar7);
                              Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&G1,(ulong)pvVar11,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&G1);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                              B2.x = 1.5365222e+16;
                              B2.y._0_2_ = 0x5a5a;
                              iVar7 = 0x2f760;
                              while( true ) {
                                bVar5 = iVar7 == 0;
                                iVar7 = iVar7 + -1;
                                if (bVar5) break;
                                Imath_3_2::
                                hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                          ((Imath_3_2 *)&G1,(Rand48 *)&B2);
                                pVVar12 = (Vec3 *)Imf_3_2::Header::dataWindow();
                                Imf_3_2::LatLongMap::pixelPosition((Box *)&G2,pVVar12);
                                lVar24 = (long)(int)(G2.y + 0.5) * stack0xfffffffffffffb60;
                                lVar26 = (long)(int)(G2.x + 0.5);
                                Imath_3_2::half::operator=
                                          ((half *)((long)pvVar11 + lVar26 * 8 + lVar24 * 8),
                                           (G1.x + 1.0) * 0.8);
                                Imath_3_2::half::operator=
                                          ((half *)((long)pvVar11 + lVar26 * 8 + 2 + lVar24 * 8),
                                           (G1.y + 1.0) * 0.8);
                                Imath_3_2::half::operator=
                                          ((half *)((long)pvVar11 + lVar26 * 8 + 4 + lVar24 * 8),
                                           (G1.z + 1.0) * 0.8);
                                pVVar19 = (Vec2 *)Imf_3_2::Header::dataWindow();
                                Imf_3_2::LatLongMap::direction((Box *)&B1,pVVar19);
                                Imath_3_2::Vec3<float>::normalized(&W1);
                                bVar5 = Imath_3_2::Vec3<float>::equalWithAbsError(&G1,&W1,1e-05);
                                if (!bVar5) {
                                  __assert_fail("dir.equalWithAbsError (dir1.normalized (), 1e-5f)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0xcf,
                                                "void (anonymous namespace)::latLongMap(const char *, const char *)"
                                               );
                                }
                              }
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        ((RgbaOutputFile *)&G1,pcVar17,(Header *)&M1,WRITE_RGB,iVar7
                                        );
                              Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&G1,(ulong)pvVar11,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&G1);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                              remove(local_3a8);
                              remove(pcVar17);
                              Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                                        ((Array2D<Imf_3_2::Rgba> *)&R1);
                              Imf_3_2::Header::~Header((Header *)&M1);
                              std::__cxx11::string::~string((string *)&c);
                              std::__cxx11::string::~string((string *)&M2);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&M2,tempDir,"imf_test_cube1.exr");
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&c,tempDir,"imf_test_cube2.exr");
                              uVar2 = M2.x[0]._0_8_;
                              pcVar17 = (char *)CONCAT44(fStack_444,_c);
                              poVar8 = std::operator<<((ostream *)&std::cout,"cube environment map")
                              ;
                              std::endl<char,std::char_traits<char>>(poVar8);
                              R1.x = 0.0;
                              R1.y = 0.0;
                              Imf_3_2::Header::Header
                                        ((Header *)&M1,0x80,0x300,1.0,(Vec2 *)&R1,1.0,INCREASING_Y,
                                         ZIP_COMPRESSION);
                              R1.x = 1.4013e-45;
                              Imf_3_2::addEnvmap((Header *)&M1,(Envmap *)&R1);
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              iVar7 = Imf_3_2::CubeMap::sizeOfFace(pBVar13);
                              if (iVar7 != 0x80) {
                                __assert_fail("sof == N",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0xe9,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              uVar18 = 0;
                              while (uVar18 != 6) {
                                Imf_3_2::Header::dataWindow();
                                Imf_3_2::CubeMap::dataWindowForFace
                                          ((CubeMapFace)&R1,(Box *)(ulong)uVar18);
                                if ((int)R1.z - (int)R1.x != 0x7f) {
                                  __assert_fail("dw1.max.x - dw1.min.x == sof - 1",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0xf0,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                                if (iStack_49c - (int)R1.y != 0x7f) {
                                  __assert_fail("dw1.max.y - dw1.min.y == sof - 1",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0xf1,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                                pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)
                                          Imf_3_2::Header::dataWindow();
                                bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::intersects
                                                  (pBVar14,(Vec2<int> *)&R1);
                                if (!bVar5) {
                                  __assert_fail("header.dataWindow ().intersects (dw1.min)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0xf2,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                                pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)
                                          Imf_3_2::Header::dataWindow();
                                bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::intersects
                                                  (pBVar14,(Vec2<int> *)&R1.z);
                                if (!bVar5) {
                                  __assert_fail("header.dataWindow ().intersects (dw1.max)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0xf3,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                                uVar18 = uVar18 + 1;
                                for (uVar21 = uVar18; uVar21 != 6; uVar21 = uVar21 + 1) {
                                  Imf_3_2::Header::dataWindow();
                                  Imf_3_2::CubeMap::dataWindowForFace
                                            ((CubeMapFace)&G1,(Box *)(ulong)uVar21);
                                  if (((int)G1.x <= (int)R1.z) && ((int)R1.x <= (int)G1.z)) {
                                    if (((int)G1.y <= iStack_49c) && ((int)R1.y <= local_47c)) {
                                      __assert_fail("!dw1.intersects (dw2)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0xf9,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                  );
                                    }
                                  }
                                }
                              }
                              R1.x = 1.0;
                              R1.y = 0.0;
                              stack0xfffffffffffffb60 = stack0xfffffffffffffb60 & 0xffffffff00000000
                              ;
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              Imf_3_2::CubeMap::faceAndPixelPosition
                                        ((Vec3 *)&R1,pBVar13,&face,(Vec2 *)&R2);
                              if (face != CUBEFACE_POS_X) {
                                __assert_fail("face == CUBEFACE_POS_X",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x103,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 63.5;
                              R1.y = 63.5;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x104,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = -1.0;
                              R1.y = 0.0;
                              stack0xfffffffffffffb60 = stack0xfffffffffffffb60 & 0xffffffff00000000
                              ;
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              Imf_3_2::CubeMap::faceAndPixelPosition
                                        ((Vec3 *)&R1,pBVar13,&face,(Vec2 *)&R2);
                              if (face != CUBEFACE_NEG_X) {
                                __assert_fail("face == CUBEFACE_NEG_X",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x109,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 63.5;
                              R1.y = 63.5;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x10a,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = 1.0;
                              stack0xfffffffffffffb60 = stack0xfffffffffffffb60 & 0xffffffff00000000
                              ;
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              Imf_3_2::CubeMap::faceAndPixelPosition
                                        ((Vec3 *)&R1,pBVar13,&face,(Vec2 *)&R2);
                              if (face != CUBEFACE_POS_Y) {
                                __assert_fail("face == CUBEFACE_POS_Y",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x10f,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 63.5;
                              R1.y = 63.5;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x110,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = -1.0;
                              stack0xfffffffffffffb60 = stack0xfffffffffffffb60 & 0xffffffff00000000
                              ;
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              Imf_3_2::CubeMap::faceAndPixelPosition
                                        ((Vec3 *)&R1,pBVar13,&face,(Vec2 *)&R2);
                              if (face != CUBEFACE_NEG_Y) {
                                __assert_fail("face == CUBEFACE_NEG_Y",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x115,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 63.5;
                              R1.y = 63.5;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x116,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = 0.0;
                              R1.z = 1.0;
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              Imf_3_2::CubeMap::faceAndPixelPosition
                                        ((Vec3 *)&R1,pBVar13,&face,(Vec2 *)&R2);
                              if (face != CUBEFACE_POS_Z) {
                                __assert_fail("face == CUBEFACE_POS_Z",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x11b,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 63.5;
                              R1.y = 63.5;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x11c,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 0.0;
                              R1.y = 0.0;
                              stack0xfffffffffffffb60 = CONCAT44(iStack_49c,0xbf800000);
                              pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                              Imf_3_2::CubeMap::faceAndPixelPosition
                                        ((Vec3 *)&R1,pBVar13,&face,(Vec2 *)&R2);
                              if (face != CUBEFACE_NEG_Z) {
                                __assert_fail("face == CUBEFACE_NEG_Z",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x121,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 63.5;
                              R1.y = 63.5;
                              bVar5 = Imath_3_2::Vec2<float>::equalWithAbsError
                                                ((Vec2<float> *)&R2,(Vec2<float> *)&R1,0.000128);
                              if (!bVar5) {
                                __assert_fail("pos.equalWithAbsError (V2f ((sof - 1), (sof - 1)) / 2, 1e-6 * W)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x122,
                                              "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                             );
                              }
                              R1.x = 1.0762e-42;
                              R1.y = 0.0;
                              stack0xfffffffffffffb60 = 0x80;
                              pvVar11 = operator_new__(0xc0000);
                              lVar26 = 0;
                              for (lVar24 = 0; lVar22 = 4, lVar24 != 0x300; lVar24 = lVar24 + 1) {
                                for (; lVar22 != 0x404; lVar22 = lVar22 + 8) {
                                  lVar20 = stack0xfffffffffffffb60 * lVar26;
                                  phVar15 = Imath_3_2::half::operator=
                                                      ((half *)((long)pvVar11 + lVar22 + lVar20),0.0
                                                      );
                                  uVar1 = phVar15->_h;
                                  *(uint16_t *)((long)pvVar11 + lVar22 + -2 + lVar20) = uVar1;
                                  *(uint16_t *)((long)pvVar11 + lVar22 + -4 + lVar20) = uVar1;
                                }
                                lVar26 = lVar26 + 8;
                              }
                              for (uVar18 = 0; uVar18 != 6; uVar18 = uVar18 + 1) {
                                for (iVar7 = 0; iVar7 != 0x80; iVar7 = iVar7 + 1) {
                                  local_424 = (float)iVar7;
                                  for (iVar23 = 0; iVar23 != 0x80; iVar23 = iVar23 + 1) {
                                    uVar16 = Imf_3_2::Header::dataWindow();
                                    G2.y = local_424;
                                    G2.x = (float)iVar23;
                                    Imf_3_2::CubeMap::pixelPosition(&B1,uVar18,uVar16,&G2);
                                    lVar26 = (long)(int)(B1.y + 0.5) * stack0xfffffffffffffb60;
                                    local_3a8 = (char *)(double)B1.x;
                                    pVVar19 = (Vec2 *)Imf_3_2::Header::dataWindow();
                                    W1.y = local_424;
                                    W1.x = (float)iVar23;
                                    Imf_3_2::CubeMap::direction
                                              ((CubeMapFace)&G1,(Box *)(ulong)uVar18,pVVar19);
                                    phVar15 = (half *)((long)pvVar11 +
                                                      (long)(int)((double)local_3a8 + 0.5) * 8 +
                                                      lVar26 * 8);
                                    Imath_3_2::Vec3<float>::normalize(&G1);
                                    Imath_3_2::half::operator=(phVar15,G1.x + 1.0);
                                    Imath_3_2::half::operator=(phVar15 + 1,G1.y + 1.0);
                                    Imath_3_2::half::operator=(phVar15 + 2,G1.z + 1.0);
                                  }
                                }
                              }
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        ((RgbaOutputFile *)&G1,(char *)uVar2,(Header *)&M1,WRITE_RGB
                                         ,iVar7);
                              Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&G1,(ulong)pvVar11,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&G1);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                              lVar26 = (long)pvVar11 + 4;
                              for (lVar24 = 0; lVar24 != 0x300; lVar24 = lVar24 + 1) {
                                for (lVar22 = 0; lVar22 != 0x80; lVar22 = lVar22 + 1) {
                                  if ((((*(float *)(_imath_half_to_float_table +
                                                   (ulong)*(ushort *)(lVar26 + -4 + lVar22 * 8) * 4)
                                         == 0.0) &&
                                       (fVar27 = *(float *)(_imath_half_to_float_table +
                                                           (ulong)*(ushort *)
                                                                   (lVar26 + -2 + lVar22 * 8) * 4),
                                       fVar27 == 0.0)) && (!NAN(fVar27))) &&
                                     ((fVar27 = *(float *)(_imath_half_to_float_table +
                                                          (ulong)*(ushort *)(lVar26 + lVar22 * 8) *
                                                          4), fVar27 == 0.0 && (!NAN(fVar27))))) {
                                    __assert_fail("p.r != 0 || p.g != 0 || p.b != 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x150,
                                                  "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                                 );
                                  }
                                }
                                lVar26 = lVar26 + stack0xfffffffffffffb60 * 8;
                              }
                              rand_1._state[0] = 0x5a5a;
                              rand_1._state[1] = 0x5a5a;
                              rand_1._state[2] = 0x5a5a;
                              iVar7 = 0x48000;
                              while (bVar5 = iVar7 != 0, iVar7 = iVar7 + -1, bVar5) {
                                Imath_3_2::
                                hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>
                                          ((Imath_3_2 *)&G1,&rand_1);
                                pBVar13 = (Box *)Imf_3_2::Header::dataWindow();
                                Imf_3_2::CubeMap::faceAndPixelPosition
                                          ((Vec3 *)&G1,pBVar13,&face_2,(Vec2 *)&B2);
                                VVar4 = _face_2;
                                uVar16 = Imf_3_2::Header::dataWindow();
                                local_380.y._0_2_ = B2.y._0_2_;
                                local_380.x = B2.x;
                                local_380.y._2_2_ = B2.y._2_2_;
                                Imf_3_2::CubeMap::pixelPosition
                                          (&W2,(ulong)VVar4 & 0xffffffff,uVar16,&local_380);
                                lVar26 = (long)(int)(W2.y + 0.5) * stack0xfffffffffffffb60;
                                lVar24 = (long)(int)(W2.x + 0.5);
                                Imath_3_2::half::operator=
                                          ((half *)((long)pvVar11 + lVar24 * 8 + lVar26 * 8),
                                           (G1.x + 1.0) * 0.8);
                                Imath_3_2::half::operator=
                                          ((half *)((long)pvVar11 + lVar24 * 8 + lVar26 * 8 + 2),
                                           (G1.y + 1.0) * 0.8);
                                Imath_3_2::half::operator=
                                          ((half *)((long)pvVar11 + lVar24 * 8 + lVar26 * 8 + 4),
                                           (G1.z + 1.0) * 0.8);
                                VVar4 = _face_2;
                                pVVar19 = (Vec2 *)Imf_3_2::Header::dataWindow();
                                Imf_3_2::CubeMap::direction
                                          ((CubeMapFace)&B1,(Box *)((ulong)VVar4 & 0xffffffff),
                                           pVVar19);
                                Imath_3_2::Vec3<float>::normalized(&W1);
                                bVar5 = Imath_3_2::Vec3<float>::equalWithAbsError(&G1,&W1,1e-06);
                                if (!bVar5) {
                                  __assert_fail("dir.equalWithAbsError (dir1.normalized (), 1e-6f)",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x168,
                                                "void (anonymous namespace)::cubeMap(const char *, const char *)"
                                               );
                                }
                              }
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        ((RgbaOutputFile *)&G1,pcVar17,(Header *)&M1,WRITE_RGB,iVar7
                                        );
                              Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&G1,(ulong)pvVar11,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&G1);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                              remove((char *)uVar2);
                              remove(pcVar17);
                              Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
                                        ((Array2D<Imf_3_2::Rgba> *)&R1);
                              Imf_3_2::Header::~Header((Header *)&M1);
                              std::__cxx11::string::~string((string *)&c);
                              std::__cxx11::string::~string((string *)&M2);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&c,tempDir,"imf_test_keycode.exr");
                              pcVar17 = (char *)CONCAT44(fStack_444,_c);
                              poVar8 = std::operator<<((ostream *)&std::cout,"key code attribute");
                              std::endl<char,std::char_traits<char>>(poVar8);
                              std::operator<<((ostream *)&std::cout,"writing, ");
                              Imf_3_2::KeyCode::KeyCode
                                        ((KeyCode *)&R1,0xc,0x22,0x1e240,0x4d2,0x2d,3,0x50);
                              iVar7 = Imf_3_2::KeyCode::filmMfcCode();
                              if (iVar7 != 0xc) {
                                __assert_fail("k1.filmMfcCode () == 12",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x185,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::filmType();
                              if (iVar7 != 0x22) {
                                __assert_fail("k1.filmType () == 34",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x186,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::prefix();
                              if (iVar7 != 0x1e240) {
                                __assert_fail("k1.prefix () == 123456",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x187,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::count();
                              if (iVar7 != 0x4d2) {
                                __assert_fail("k1.count () == 1234",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x188,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfOffset();
                              if (iVar7 != 0x2d) {
                                __assert_fail("k1.perfOffset () == 45",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x189,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerFrame();
                              if (iVar7 != 3) {
                                __assert_fail("k1.perfsPerFrame () == 3",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x18a,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerCount();
                              if (iVar7 != 0x50) {
                                __assert_fail("k1.perfsPerCount () == 80",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x18b,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              pVVar19 = (Vec2 *)&M1;
                              M1.x[0][0] = 0.0;
                              M1.x[0][1] = 0.0;
                              Imf_3_2::Header::Header
                                        ((Header *)&M2,100,100,1.0,pVVar19,1.0,INCREASING_Y,
                                         ZIP_COMPRESSION);
                              cVar6 = Imf_3_2::hasKeyCode((Header *)&M2);
                              if (cVar6 != '\0') {
                                __assert_fail("hasKeyCode (header) == false",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x191,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              Imf_3_2::addKeyCode((Header *)&M2,(KeyCode *)&R1);
                              cVar6 = Imf_3_2::hasKeyCode((Header *)&M2);
                              if (cVar6 == '\0') {
                                __assert_fail("hasKeyCode (header) == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x194,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaOutputFile::RgbaOutputFile
                                        ((RgbaOutputFile *)&G1,pcVar17,(Header *)&M2,WRITE_RGBA,
                                         iVar7);
                              lVar26 = 100;
                              while (bVar5 = lVar26 != 0, lVar26 = lVar26 + -1, bVar5) {
                                Imath_3_2::half::operator=((half *)pVVar19,1.0);
                                Imath_3_2::half::operator=((half *)(pVVar19 + 2),1.0);
                                Imath_3_2::half::operator=((half *)(pVVar19 + 4),1.0);
                                Imath_3_2::half::operator=((half *)(pVVar19 + 6),1.0);
                                pVVar19 = pVVar19 + 8;
                              }
                              Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&G1,(ulong)&M1,1);
                              Imf_3_2::RgbaOutputFile::writePixels((int)&G1);
                              Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&G1);
                              poVar8 = std::operator<<((ostream *)&std::cout,"reading, comparing");
                              std::endl<char,std::char_traits<char>>(poVar8);
                              iVar7 = Imf_3_2::globalThreadCount();
                              Imf_3_2::RgbaInputFile::RgbaInputFile
                                        ((RgbaInputFile *)&M1,pcVar17,iVar7);
                              pHVar9 = (Header *)Imf_3_2::RgbaInputFile::header();
                              Imf_3_2::keyCode(pHVar9);
                              pHVar9 = (Header *)Imf_3_2::RgbaInputFile::header();
                              cVar6 = Imf_3_2::hasKeyCode(pHVar9);
                              if (cVar6 == '\0') {
                                __assert_fail("hasKeyCode (in.header ()) == true",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ac,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::filmMfcCode();
                              iVar23 = Imf_3_2::KeyCode::filmMfcCode();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.filmMfcCode () == k2.filmMfcCode ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ad,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::filmType();
                              iVar23 = Imf_3_2::KeyCode::filmType();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.filmType () == k2.filmType ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1ae,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::prefix();
                              iVar23 = Imf_3_2::KeyCode::prefix();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.prefix () == k2.prefix ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1af,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::count();
                              iVar23 = Imf_3_2::KeyCode::count();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.count () == k2.count ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1b0,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfOffset();
                              iVar23 = Imf_3_2::KeyCode::perfOffset();
                              if (iVar7 != iVar23) {
                                __assert_fail("k1.perfOffset () == k2.perfOffset ()",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1b1,
                                              "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                             );
                              }
                              iVar7 = Imf_3_2::KeyCode::perfsPerFrame();
                              iVar23 = Imf_3_2::KeyCode::perfsPerFrame();
                              if (iVar7 == iVar23) {
                                iVar7 = Imf_3_2::KeyCode::perfsPerCount();
                                iVar23 = Imf_3_2::KeyCode::perfsPerCount();
                                if (iVar7 != iVar23) {
                                  __assert_fail("k1.perfsPerCount () == k2.perfsPerCount ()",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1b3,
                                                "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                               );
                                }
                                Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&M1);
                                remove(pcVar17);
                                Imf_3_2::Header::~Header((Header *)&M2);
                                std::__cxx11::string::~string((string *)&c);
                                poVar8 = std::operator<<((ostream *)&std::cout,"time code methods");
                                std::endl<char,std::char_traits<char>>(poVar8);
                                Imf_3_2::TimeCode::TimeCode((TimeCode *)&M1);
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != 0) {
                                  __assert_fail("t.timeAndFlags () == 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1c0,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::userData();
                                if (iVar7 != 0) {
                                  __assert_fail("t.userData () == 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1c1,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                Imf_3_2::TimeCode::setFrame((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::frame();
                                if (iVar7 != 0x1d) {
                                  __assert_fail("t.frame () == 29",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1c7,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != 0x29) {
                                  __assert_fail("t.timeAndFlags () == 0x00000029",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1c8,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                                Imf_3_2::TimeCode::setFrame((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::frame();
                                if (iVar7 != 0) {
                                  __assert_fail("t.frame () == 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1cc,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != -0x40) {
                                  __assert_fail("t.timeAndFlags () == 0xffffffc0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1cd,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                Imf_3_2::TimeCode::setSeconds((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::seconds();
                                if (iVar7 != 0x3b) {
                                  __assert_fail("t.seconds () == 59",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1d3,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != 0x5900) {
                                  __assert_fail("t.timeAndFlags () == 0x00005900",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1d4,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                                Imf_3_2::TimeCode::setSeconds((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::seconds();
                                if (iVar7 != 0) {
                                  __assert_fail("t.seconds () == 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1d8,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != -0x7f01) {
                                  __assert_fail("t.timeAndFlags () == 0xffff80ff",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1d9,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                Imf_3_2::TimeCode::setMinutes((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::minutes();
                                if (iVar7 != 0x3b) {
                                  __assert_fail("t.minutes () == 59",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1df,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != 0x590000) {
                                  __assert_fail("t.timeAndFlags () == 0x00590000",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1e0,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                                Imf_3_2::TimeCode::setMinutes((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::minutes();
                                if (iVar7 != 0) {
                                  __assert_fail("t.minutes () == 0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1e4,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                if (iVar7 != -0x7f0001) {
                                  __assert_fail("t.timeAndFlags () == 0xff80ffff",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x1e5,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                Imf_3_2::TimeCode::setHours((int)&M1);
                                iVar7 = Imf_3_2::TimeCode::hours();
                                if (iVar7 == 0x17) {
                                  iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                  if (iVar7 != 0x23000000) {
                                    __assert_fail("t.timeAndFlags () == 0x23000000",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1ec,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                                  Imf_3_2::TimeCode::setHours((int)&M1);
                                  iVar7 = Imf_3_2::TimeCode::hours();
                                  if (iVar7 != 0) {
                                    __assert_fail("t.hours () == 0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1f0,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                  if (iVar7 != -0x3f000001) {
                                    __assert_fail("t.timeAndFlags () == 0xc0ffffff",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1f1,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                  Imf_3_2::TimeCode::setDropFrame(SUB81(&M1,0));
                                  cVar6 = Imf_3_2::TimeCode::dropFrame();
                                  if (cVar6 == '\0') {
                                    __assert_fail("t.dropFrame () == true",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1f7,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                  if (iVar7 != 0x40) {
                                    __assert_fail("t.timeAndFlags () == 0x00000040",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1f8,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                                  Imf_3_2::TimeCode::setDropFrame(SUB81(&M1,0));
                                  cVar6 = Imf_3_2::TimeCode::dropFrame();
                                  if (cVar6 != '\0') {
                                    __assert_fail("t.dropFrame () == false",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1fc,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                  if (iVar7 != -0x41) {
                                    __assert_fail("t.timeAndFlags () == 0xffffffbf",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x1fd,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                  Imf_3_2::TimeCode::setColorFrame(SUB81(&M1,0));
                                  cVar6 = Imf_3_2::TimeCode::colorFrame();
                                  if (cVar6 != '\0') {
                                    iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                    if (iVar7 != 0x80) {
                                      __assert_fail("t.timeAndFlags () == 0x00000080",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x204,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                    }
                                    Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,~TV60_PACKING);
                                    Imf_3_2::TimeCode::setColorFrame(SUB81(&M1,0));
                                    cVar6 = Imf_3_2::TimeCode::colorFrame();
                                    if (cVar6 != '\0') {
                                      __assert_fail("t.colorFrame () == false",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x208,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                    }
                                    iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                    if (iVar7 != -0x81) {
                                      __assert_fail("t.timeAndFlags () == 0xffffff7f",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x209,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                    }
                                    Imf_3_2::TimeCode::setTimeAndFlags((uint)&M1,TV60_PACKING);
                                    Imf_3_2::TimeCode::setFieldPhase(SUB81(&M1,0));
                                    cVar6 = Imf_3_2::TimeCode::fieldPhase();
                                    if (cVar6 != '\0') {
                                      iVar7 = Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                      if (iVar7 == 0x8000) {
                                        Imf_3_2::TimeCode::timeAndFlags((Packing)&M1);
                                        __assert_fail(
                                                  "t.timeAndFlags (TimeCode::TV50_PACKING) == 0x80000000"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x211,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                      }
                                      __assert_fail(
                                                  "t.timeAndFlags (TimeCode::TV60_PACKING) == 0x00008000"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x210,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                    }
                                    __assert_fail("t.fieldPhase () == true",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                  ,0x20f,
                                                  "void (anonymous namespace)::timeCodeMethods()");
                                  }
                                  __assert_fail("t.colorFrame () == true",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                                ,0x203,
                                                "void (anonymous namespace)::timeCodeMethods()");
                                }
                                __assert_fail("t.hours () == 23",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                              ,0x1eb,"void (anonymous namespace)::timeCodeMethods()"
                                             );
                              }
                              __assert_fail("k1.perfsPerFrame () == k2.perfsPerFrame ()",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                                            ,0x1b2,
                                            "void (anonymous namespace)::writeReadKeyCode(const char *)"
                                           );
                            }
                          }
                          __assertion = "c1.white == c2.white";
                          pcVar17 = 
                          "void (anonymous namespace)::writeReadChromaticities(const char *)";
                          uVar18 = 0x7d;
                        }
                      }
                    }
                    else {
                      __assertion = "hasChromaticities (header) == false";
                      pcVar17 = "void (anonymous namespace)::writeReadChromaticities(const char *)";
                      uVar18 = 0x5e;
                    }
                  }
                  else {
                    __assertion = "W2.equalWithAbsError (V3f (1, 1, 1), 1e-3F)";
                    pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
                    uVar18 = 0x4f;
                  }
                }
                else {
                  __assertion = "B2.equalWithAbsError (V3f (0, 0, 1), 1e-3F)";
                  pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
                  uVar18 = 0x4e;
                }
              }
              else {
                __assertion = "G2.equalWithAbsError (V3f (0, 1, 0), 1e-3F)";
                pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
                uVar18 = 0x4d;
              }
            }
            else {
              __assertion = "R2.equalWithAbsError (V3f (1, 0, 0), 1e-3F)";
              pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
              uVar18 = 0x4c;
            }
          }
          else {
            __assertion = "w1.equalWithAbsError (c.white, 1e-5F)";
            pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
            uVar18 = 0x3c;
          }
        }
        else {
          __assertion = "b1.equalWithAbsError (c.blue, 1e-5F)";
          pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
          uVar18 = 0x3b;
        }
      }
      else {
        __assertion = "g1.equalWithAbsError (c.green, 1e-5F)";
        pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
        uVar18 = 0x3a;
      }
    }
    else {
      __assertion = "r1.equalWithAbsError (c.red, 1e-5F)";
      pcVar17 = "void (anonymous namespace)::convertRGBtoXYZ()";
      uVar18 = 0x39;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                ,uVar18,pcVar17);
}

Assistant:

void
testStandardAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing optional standard attributes" << endl;

        convertRGBtoXYZ ();

        {
            std::string filename = tempDir + "imf_test_chromaticities.exr";
            writeReadChromaticities (filename.c_str ());
        }

        {
            std::string fn1 = tempDir + "imf_test_latlong1.exr";
            std::string fn2 = tempDir + "imf_test_latlong2.exr";
            latLongMap (fn1.c_str (), fn2.c_str ());
        }

        {
            std::string fn1 = tempDir + "imf_test_cube1.exr";
            std::string fn2 = tempDir + "imf_test_cube2.exr";
            cubeMap (fn1.c_str (), fn2.c_str ());
        }

        {
            std::string filename = tempDir + "imf_test_keycode.exr";
            writeReadKeyCode (filename.c_str ());
        }

        {
            timeCodeMethods ();
            std::string filename = tempDir + "imf_test_timecode.exr";
            writeReadTimeCode (filename.c_str ());
        }

        {
            rationalMethods ();
            std::string filename = tempDir + "imf_test_rational.exr";
            writeReadRational (filename.c_str ());
        }

        generatedFunctions ();

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}